

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O0

int __thiscall
ncnn::DeformableConv2D_x86::forward
          (DeformableConv2D_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_type sVar7;
  reference pvVar8;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  double dVar9;
  Mat output_t;
  float v4;
  float v3;
  float v2;
  float v1;
  float val;
  int c_im;
  float *data_im_channel_ptr;
  float hw;
  float hh;
  float lw;
  float lh;
  int w_high;
  int h_high;
  int w_low;
  int h_low;
  int v4_pos;
  int v3_pos;
  int v2_pos;
  int v1_pos;
  bool v4_cond;
  bool v3_cond;
  bool v2_cond;
  bool v1_cond;
  float w4;
  float w3;
  float w2;
  float w1;
  bool cond;
  float w_im;
  float h_im;
  float mask_;
  float offset_w;
  float offset_h;
  int data_offset_w_ptr;
  int data_offset_h_ptr;
  int j;
  int i;
  float *data_col_ptr;
  int w_in;
  int h_in;
  int w_col;
  int h_col;
  float *im2col_ptr;
  float *data_offset_ptr;
  float *data_im_ptr;
  Mat offset_flatten;
  Mat bottom_blob_flatten;
  Mat *output;
  Mat im2col;
  int out_h;
  int out_w;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int in_c;
  int h;
  int w;
  bool has_mask;
  Mat *offset;
  Mat *bottom_blob;
  Mat *m;
  Allocator *in_stack_fffffffffffff858;
  void **ppvVar10;
  size_t in_stack_fffffffffffff860;
  int in_stack_fffffffffffff868;
  int in_stack_fffffffffffff86c;
  Mat *in_stack_fffffffffffff870;
  Allocator *in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff8d0;
  Mat *in_stack_fffffffffffff8d8;
  float local_718;
  float local_714;
  float local_710;
  float local_70c;
  bool local_708;
  bool local_707;
  bool local_706;
  bool local_705;
  bool local_6f9;
  float local_6ec;
  Allocator *_allocator;
  void *pvVar11;
  int _c;
  int in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  int _w;
  bool local_69a;
  value_type local_678;
  value_type local_630;
  void *local_5e8;
  int *local_5e0;
  long *local_5c8;
  float local_5a0;
  float local_59c;
  float local_598;
  float local_594;
  float local_590;
  int local_58c;
  void *local_588;
  float local_57c;
  float local_578;
  float local_574;
  float local_570;
  int local_56c;
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_550;
  bool local_54c;
  bool local_54b;
  bool local_54a;
  bool local_549;
  float local_548;
  float local_544;
  float local_540;
  float local_53c;
  bool local_535;
  float local_534;
  float local_530;
  char local_529;
  void *local_528;
  int *local_520;
  ulong local_518;
  int local_510;
  Allocator *local_508;
  int local_500;
  int local_4fc;
  int local_4f8;
  undefined4 local_4f4;
  int local_4f0;
  ulong local_4e8;
  float local_4dc;
  float local_4d8;
  float local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  float *local_4c0;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  void *local_4a8;
  Allocator *local_4a0;
  void *local_498;
  Allocator *local_490;
  int *local_488;
  undefined8 local_480;
  undefined4 local_478;
  long *local_470;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined8 local_450;
  void *local_448;
  int *local_440;
  undefined8 local_438;
  undefined4 local_430;
  long *local_428;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined8 local_408;
  reference local_400;
  undefined4 local_3f8;
  void *local_3e8;
  int *local_3e0;
  void *local_3d8;
  undefined4 local_3d0;
  long *local_3c8;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  int local_3b0;
  void *local_3a8;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  size_t local_390;
  int local_388;
  int local_384;
  int local_380;
  byte local_379;
  const_reference local_378;
  const_reference local_370;
  undefined8 local_368;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_360;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_358;
  int local_344;
  void **local_340;
  value_type *local_338;
  reference local_330;
  void **local_328;
  void **local_320;
  void **local_318;
  void **local_308;
  value_type *local_2f8;
  value_type *local_2e8;
  Allocator **local_2d8;
  void **local_2c8;
  void **local_2b8;
  int local_2a4;
  void **local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  Allocator **local_240;
  int local_228;
  undefined4 local_224;
  value_type *local_220;
  int local_208;
  undefined4 local_204;
  value_type *local_200;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  int local_1b8;
  undefined4 local_1b4;
  reference local_1b0;
  reference local_1a8;
  reference local_1a0;
  int local_198;
  undefined4 local_194;
  reference local_190;
  int local_188;
  undefined4 local_184;
  value_type *local_180;
  value_type *local_178;
  value_type *local_170;
  int local_168;
  undefined4 local_164;
  value_type *local_160;
  int local_158;
  undefined4 local_154;
  void **local_150;
  void **local_148;
  void **local_140;
  int local_138;
  undefined4 local_134;
  void **local_130;
  Allocator **local_128;
  void **local_120;
  undefined1 local_115;
  int local_114;
  const_reference local_110;
  void **local_108;
  void **local_e8;
  reference local_e0;
  Allocator *local_d8;
  int local_cc;
  ulong local_c8;
  void *local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  void **local_a8;
  undefined4 local_9c;
  long local_98;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_40;
  void *local_10;
  
  local_368 = in_RCX;
  local_360 = in_RDX;
  local_358 = in_RSI;
  local_370 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_378 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_358,1);
  sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_358);
  local_379 = sVar7 == 3;
  local_380 = local_370->w;
  local_384 = local_370->h;
  local_388 = local_370->c;
  local_390 = local_370->elemsize;
  local_394 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  local_398 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_39c = ((local_380 + *(int *)((long)in_RDI + lVar1 + 0xec) +
               *(int *)((long)in_RDI + lVar1 + 0xf0)) - local_394) /
              *(int *)((long)in_RDI + lVar1 + 0xe4) + 1;
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_3a0 = ((local_384 + *(int *)((long)in_RDI + lVar1 + 0xf4) +
               *(int *)((long)in_RDI + lVar1 + 0xf8)) - local_398) /
              *(int *)((long)in_RDI + lVar1 + 0xe8) + 1;
  local_340 = &local_3e8;
  local_3e8 = (void *)0x0;
  local_3e0 = (int *)0x0;
  local_3d8 = (void *)0x0;
  local_3d0 = 0;
  local_3c8 = (long *)0x0;
  local_3c0 = 0;
  local_3bc = 0;
  local_3b8 = 0;
  local_3b4 = 0;
  local_3b0 = 0;
  local_3a8 = (void *)0x0;
  Mat::create(in_stack_fffffffffffff870,in_stack_fffffffffffff86c,in_stack_fffffffffffff860,
              in_stack_fffffffffffff858);
  local_328 = &local_3e8;
  if (local_3e8 != (void *)0x0) {
    local_e8 = local_328;
  }
  if (local_3e8 != (void *)0x0 && (long)local_3a8 * (long)local_3b0 != 0) {
    local_400 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,0);
    Mat::create(in_stack_fffffffffffff870,in_stack_fffffffffffff86c,in_stack_fffffffffffff868,
                in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    local_330 = local_400;
    local_69a = true;
    if (local_400->data != (void *)0x0) {
      local_e0 = local_400;
      local_69a = local_400->cstep * (long)local_400->c == 0;
    }
    _w = CONCAT13(local_69a,(int3)in_stack_fffffffffffff954);
    if (local_69a == false) {
      pvVar8 = local_400;
      Mat::reshape(in_stack_fffffffffffff8d8,(int)((ulong)in_stack_fffffffffffff8d0 >> 0x20),
                   in_stack_fffffffffffff8c8);
      Mat::reshape(in_stack_fffffffffffff8d8,(int)((ulong)in_stack_fffffffffffff8d0 >> 0x20),
                   in_stack_fffffffffffff8c8);
      local_120 = &local_448;
      local_498 = local_448;
      local_128 = &local_490;
      local_4a0 = local_490;
      local_320 = &local_3e8;
      local_4a8 = local_3e8;
      _allocator = local_490;
      pvVar11 = local_448;
      for (local_4ac = 0; _c = (int)((ulong)pvVar11 >> 0x20), local_4ac < local_3a0;
          local_4ac = local_4ac + 1) {
        for (local_4b0 = 0; local_4b0 < local_39c; local_4b0 = local_4b0 + 1) {
          local_4b4 = local_4ac * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) -
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
          local_4b8 = local_4b0 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) -
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          local_4c0 = (float *)((long)local_4a8 +
                               (long)((local_4ac * local_39c + local_4b0) *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                                     local_388) * 4);
          for (local_4c4 = 0; local_4c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)
              ; local_4c4 = local_4c4 + 1) {
            for (local_4c8 = 0;
                local_4c8 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                local_4c8 = local_4c8 + 1) {
              local_4cc = ((local_4c4 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) +
                           local_4c8) * 2 * local_3a0 + local_4ac) * local_39c + local_4b0;
              local_4d0 = (((local_4c4 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
                            + local_4c8) * 2 + 1) * local_3a0 + local_4ac) * local_39c + local_4b0;
              local_4d4 = *(float *)((long)&local_4a0->_vptr_Allocator + (long)local_4cc * 4);
              local_4d8 = *(float *)((long)&local_4a0->_vptr_Allocator + (long)local_4d0 * 4);
              local_529 = '\0';
              if ((local_379 & 1) == 0) {
                local_6ec = 1.0;
              }
              else {
                local_110 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                      (local_358,2);
                local_114 = local_4c4 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) +
                            local_4c8;
                local_108 = &local_528;
                local_ac = local_110->w;
                local_b0 = local_110->h;
                local_b4 = local_110->d;
                local_c0 = (void *)((long)local_110->data +
                                   local_110->cstep * (long)local_114 * local_110->elemsize);
                local_c8 = local_110->elemsize;
                local_cc = local_110->elempack;
                local_d8 = local_110->allocator;
                local_a8 = &local_528;
                local_520 = (int *)0x0;
                local_4f4 = 1;
                local_98 = (long)local_ac * (long)local_b0 * local_c8;
                local_4e8 = (local_98 + 0xfU & 0xfffffffffffffff0) / local_c8;
                local_500 = local_110->dims + -1;
                if (local_110->dims == 4) {
                  local_4e8 = (long)local_110->w * (long)local_110->h;
                }
                local_9c = 0x10;
                local_115 = 1;
                local_529 = '\x01';
                local_2a0 = &local_528;
                local_2a4 = local_4ac;
                local_6ec = *(float *)((long)local_c0 +
                                      (long)local_4b0 * 4 +
                                      (long)local_ac * (long)local_4ac * local_c8);
                local_528 = local_c0;
                local_518 = local_c8;
                local_510 = local_cc;
                local_508 = local_d8;
                local_4fc = local_ac;
                local_4f8 = local_b0;
                local_4f0 = local_b4;
              }
              if (local_529 != '\0') {
                local_318 = &local_528;
                local_1c0 = local_318;
                if (local_520 != (int *)0x0) {
                  local_1c4 = 0xffffffff;
                  LOCK();
                  local_1c8 = *local_520;
                  *local_520 = *local_520 + -1;
                  UNLOCK();
                  if (local_1c8 == 1) {
                    if (local_508 == (Allocator *)0x0) {
                      local_70 = local_528;
                      if (local_528 != (void *)0x0) {
                        free(local_528);
                      }
                    }
                    else {
                      (*local_508->_vptr_Allocator[3])(local_508,local_528);
                    }
                  }
                }
                local_528 = (void *)0x0;
                local_518 = 0;
                local_510 = 0;
                local_500 = 0;
                local_4fc = 0;
                local_4f8 = 0;
                local_4f4 = 0;
                local_4f0 = 0;
                local_4e8 = 0;
                local_520 = (int *)0x0;
              }
              local_4dc = local_6ec;
              local_530 = (float)(local_4b4 +
                                 local_4c4 *
                                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0)) +
                          local_4d4;
              local_534 = (float)(local_4b8 +
                                 local_4c8 *
                                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) +
                          local_4d8;
              local_6f9 = false;
              if (((-1.0 < local_530) && (local_6f9 = false, -1.0 < local_534)) &&
                 (local_6f9 = false, local_530 < (float)local_384)) {
                local_6f9 = local_534 < (float)local_380;
              }
              local_535 = local_6f9;
              local_53c = 0.0;
              local_540 = 0.0;
              local_544 = 0.0;
              local_548 = 0.0;
              local_549 = false;
              local_54a = false;
              local_54b = false;
              local_54c = false;
              local_550 = 0;
              local_554 = 0;
              local_558 = 0;
              local_55c = 0;
              if (local_6f9 != false) {
                dVar9 = std::floor((double)(ulong)(uint)local_530);
                local_560 = (int)SUB84(dVar9,0);
                dVar9 = std::floor((double)(ulong)(uint)local_534);
                local_564 = (int)SUB84(dVar9,0);
                local_568 = local_560 + 1;
                local_56c = local_564 + 1;
                local_570 = local_530 - (float)local_560;
                local_574 = local_534 - (float)local_564;
                local_578 = 1.0 - local_570;
                local_57c = 1.0 - local_574;
                local_705 = -1 < local_560 && -1 < local_564;
                local_549 = local_705;
                bVar3 = local_56c <= local_380 + -1;
                local_706 = -1 < local_560 && bVar3;
                local_54a = local_706;
                bVar5 = local_568 <= local_384 + -1;
                local_707 = bVar5 && -1 < local_564;
                local_54b = local_707;
                bVar6 = local_568 <= local_384 + -1;
                bVar4 = local_56c <= local_380 + -1;
                local_708 = bVar6 && bVar4;
                local_54c = local_708;
                if (-1 < local_560 && -1 < local_564) {
                  local_550 = local_560 * local_380 + local_564;
                }
                if (-1 < local_560 && bVar3) {
                  local_554 = local_560 * local_380 + local_56c;
                }
                if (bVar5 && -1 < local_564) {
                  local_558 = local_568 * local_380 + local_564;
                }
                if (bVar6 && bVar4) {
                  local_55c = local_568 * local_380 + local_56c;
                }
                local_53c = local_578 * local_57c;
                local_540 = local_578 * local_574;
                local_544 = local_570 * local_57c;
                local_548 = local_570 * local_574;
              }
              local_588 = local_498;
              for (local_58c = 0; local_58c < local_388; local_58c = local_58c + 1) {
                local_590 = 0.0;
                if ((local_535 & 1U) != 0) {
                  if (local_549 == false) {
                    local_70c = 0.0;
                  }
                  else {
                    local_70c = *(float *)((long)local_588 + (long)local_550 * 4);
                  }
                  local_594 = local_70c;
                  if (local_54a == false) {
                    local_710 = 0.0;
                  }
                  else {
                    local_710 = *(float *)((long)local_588 + (long)local_554 * 4);
                  }
                  local_598 = local_710;
                  if (local_54b == false) {
                    local_714 = 0.0;
                  }
                  else {
                    local_714 = *(float *)((long)local_588 + (long)local_558 * 4);
                  }
                  local_59c = local_714;
                  if (local_54c == false) {
                    local_718 = 0.0;
                  }
                  else {
                    local_718 = *(float *)((long)local_588 + (long)local_55c * 4);
                  }
                  local_5a0 = local_718;
                  local_590 = local_53c * local_70c + local_540 * local_710 + local_544 * local_714
                              + local_548 * local_718;
                }
                *local_4c0 = local_590 * local_4dc;
                local_4c0 = local_4c0 + 1;
                local_588 = (void *)((long)local_588 + (long)(local_384 * local_380) * 4);
              }
            }
          }
        }
      }
      Mat::reshape(in_stack_fffffffffffff8d8,(int)((ulong)in_stack_fffffffffffff8d0 >> 0x20),
                   (int)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_150 = &local_5e8;
      local_148 = &local_3e8;
      if (&local_3e8 != local_150) {
        if (local_5e0 != (int *)0x0) {
          local_154 = 1;
          LOCK();
          local_158 = *local_5e0;
          *local_5e0 = *local_5e0 + 1;
          UNLOCK();
        }
        ppvVar10 = &local_3e8;
        local_130 = &local_3e8;
        if (local_3e0 != (int *)0x0) {
          local_134 = 0xffffffff;
          LOCK();
          local_138 = *local_3e0;
          *local_3e0 = *local_3e0 + -1;
          UNLOCK();
          if (local_138 == 1) {
            if (local_3c8 == (long *)0x0) {
              local_88 = local_3e8;
              if (local_3e8 != (void *)0x0) {
                free(local_3e8);
              }
            }
            else {
              (**(code **)(*local_3c8 + 0x18))(local_3c8,local_3e8);
            }
          }
        }
        *ppvVar10 = (void *)0x0;
        ppvVar10[2] = (void *)0x0;
        *(undefined4 *)(ppvVar10 + 3) = 0;
        *(undefined4 *)(ppvVar10 + 5) = 0;
        *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
        *(undefined4 *)(ppvVar10 + 6) = 0;
        *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
        *(undefined4 *)(ppvVar10 + 7) = 0;
        ppvVar10[8] = (void *)0x0;
        ppvVar10[1] = (void *)0x0;
        local_3e8 = *local_150;
        local_3e0 = (int *)local_150[1];
        local_3d8 = local_150[2];
        local_3d0 = *(undefined4 *)(local_150 + 3);
        local_3c8 = (long *)local_150[4];
        local_3c0 = *(undefined4 *)(local_150 + 5);
        local_3bc = *(undefined4 *)((long)local_150 + 0x2c);
        local_3b8 = *(undefined4 *)(local_150 + 6);
        local_3b4 = *(undefined4 *)((long)local_150 + 0x34);
        local_3b0 = *(int *)(local_150 + 7);
        local_3a8 = local_150[8];
      }
      ppvVar10 = &local_5e8;
      local_308 = ppvVar10;
      local_1e0 = ppvVar10;
      local_140 = &local_3e8;
      if (local_5e0 != (int *)0x0) {
        local_1e4 = 0xffffffff;
        LOCK();
        local_1e8 = *local_5e0;
        *local_5e0 = *local_5e0 + -1;
        UNLOCK();
        if (local_1e8 == 1) {
          if (local_5c8 == (long *)0x0) {
            if (local_5e8 != (void *)0x0) {
              free(local_5e8);
            }
          }
          else {
            (**(code **)(*local_5c8 + 0x18))(local_5c8,local_5e8);
          }
        }
      }
      *ppvVar10 = (void *)0x0;
      ppvVar10[2] = (void *)0x0;
      *(undefined4 *)(ppvVar10 + 3) = 0;
      *(undefined4 *)(ppvVar10 + 5) = 0;
      *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
      *(undefined4 *)(ppvVar10 + 6) = 0;
      *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
      *(undefined4 *)(ppvVar10 + 7) = 0;
      ppvVar10[8] = (void *)0x0;
      ppvVar10[1] = (void *)0x0;
      (**(code **)(*(long *)in_RDI[10] + 0x38))((long *)in_RDI[10],&local_3e8,local_400,local_368);
      local_338 = &local_630;
      local_630.data = (void *)0x0;
      local_630.refcount = (int *)0x0;
      local_630.elemsize = 0;
      local_630.elempack = 0;
      local_630.allocator = (Allocator *)0x0;
      local_630.dims = 0;
      local_630.w = 0;
      local_630.h = 0;
      local_630.d = 0;
      local_630.c = 0;
      local_630.cstep = 0;
      (**(code **)(*(long *)in_RDI[0xb] + 0x38))((long *)in_RDI[0xb],local_400,&local_630,local_368)
      ;
      Mat::reshape(pvVar8,_w,in_stack_fffffffffffff950,_c,_allocator);
      local_180 = &local_678;
      local_178 = &local_630;
      if (&local_630 != local_180) {
        if (local_678.refcount != (int *)0x0) {
          local_184 = 1;
          LOCK();
          local_188 = *local_678.refcount;
          *local_678.refcount = *local_678.refcount + 1;
          UNLOCK();
        }
        local_160 = &local_630;
        if (local_630.refcount != (int *)0x0) {
          local_164 = 0xffffffff;
          LOCK();
          local_168 = *local_630.refcount;
          *local_630.refcount = *local_630.refcount + -1;
          UNLOCK();
          if (local_168 == 1) {
            if (local_630.allocator == (Allocator *)0x0) {
              local_80 = local_630.data;
              if (local_630.data != (void *)0x0) {
                free(local_630.data);
              }
            }
            else {
              (*(local_630.allocator)->_vptr_Allocator[3])(local_630.allocator,local_630.data);
            }
          }
        }
        local_630.data = (void *)0x0;
        local_630.elemsize = 0;
        local_630.elempack = 0;
        local_630.dims = 0;
        local_630.w = 0;
        local_630.h = 0;
        local_630.d = 0;
        local_630.c = 0;
        local_630.cstep = 0;
        local_630.refcount = (int *)0x0;
        local_630.data = local_180->data;
        local_630.refcount = local_180->refcount;
        local_630.elemsize = local_180->elemsize;
        local_630.elempack = local_180->elempack;
        local_630.allocator = local_180->allocator;
        local_630.dims = local_180->dims;
        local_630.w = local_180->w;
        local_630.h = local_180->h;
        local_630.d = local_180->d;
        local_630.c = local_180->c;
        local_630.cstep = local_180->cstep;
      }
      local_2f8 = &local_678;
      local_200 = local_2f8;
      local_170 = &local_630;
      if (local_678.refcount != (int *)0x0) {
        local_204 = 0xffffffff;
        LOCK();
        local_208 = *local_678.refcount;
        *local_678.refcount = *local_678.refcount + -1;
        UNLOCK();
        if (local_208 == 1) {
          if (local_678.allocator == (Allocator *)0x0) {
            if (local_678.data != (void *)0x0) {
              free(local_678.data);
            }
          }
          else {
            (*(local_678.allocator)->_vptr_Allocator[3])(local_678.allocator,local_678.data);
          }
        }
      }
      local_678.data = (void *)0x0;
      local_678.elemsize = 0;
      local_678.elempack = 0;
      local_678.dims = 0;
      local_678.w = 0;
      local_678.h = 0;
      local_678.d = 0;
      local_678.c = 0;
      local_678.cstep = 0;
      local_678.refcount = (int *)0x0;
      pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,0);
      local_1b0 = &local_630;
      local_1a8 = pvVar8;
      if (pvVar8 != local_1b0) {
        if (local_630.refcount != (int *)0x0) {
          local_1b4 = 1;
          LOCK();
          local_1b8 = *local_630.refcount;
          *local_630.refcount = *local_630.refcount + 1;
          UNLOCK();
        }
        local_190 = pvVar8;
        if (pvVar8->refcount != (int *)0x0) {
          piVar2 = pvVar8->refcount;
          local_194 = 0xffffffff;
          LOCK();
          local_198 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (local_198 == 1) {
            if (pvVar8->allocator == (Allocator *)0x0) {
              local_78 = pvVar8->data;
              if (local_78 != (void *)0x0) {
                free(local_78);
              }
            }
            else {
              (*pvVar8->allocator->_vptr_Allocator[3])(pvVar8->allocator,pvVar8->data);
            }
          }
        }
        pvVar8->data = (void *)0x0;
        pvVar8->elemsize = 0;
        pvVar8->elempack = 0;
        pvVar8->dims = 0;
        pvVar8->w = 0;
        pvVar8->h = 0;
        pvVar8->d = 0;
        pvVar8->c = 0;
        pvVar8->cstep = 0;
        pvVar8->refcount = (int *)0x0;
        pvVar8->data = local_1b0->data;
        pvVar8->refcount = local_1b0->refcount;
        pvVar8->elemsize = local_1b0->elemsize;
        pvVar8->elempack = local_1b0->elempack;
        pvVar8->allocator = local_1b0->allocator;
        pvVar8->dims = local_1b0->dims;
        pvVar8->w = local_1b0->w;
        pvVar8->h = local_1b0->h;
        pvVar8->d = local_1b0->d;
        pvVar8->c = local_1b0->c;
        pvVar8->cstep = local_1b0->cstep;
      }
      local_344 = 0;
      local_3f8 = 1;
      local_2e8 = &local_630;
      local_220 = local_2e8;
      local_1a0 = pvVar8;
      if (local_630.refcount != (int *)0x0) {
        local_224 = 0xffffffff;
        LOCK();
        local_228 = *local_630.refcount;
        *local_630.refcount = *local_630.refcount + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (local_630.allocator == (Allocator *)0x0) {
            local_40 = local_630.data;
            if (local_630.data != (void *)0x0) {
              free(local_630.data);
            }
          }
          else {
            (*(local_630.allocator)->_vptr_Allocator[3])(local_630.allocator,local_630.data);
          }
        }
      }
      local_630.data = (void *)0x0;
      local_630.elemsize = 0;
      local_630.elempack = 0;
      local_630.dims = 0;
      local_630.w = 0;
      local_630.h = 0;
      local_630.d = 0;
      local_630.c = 0;
      local_630.cstep = 0;
      local_630.refcount = (int *)0x0;
      local_2d8 = &local_490;
      local_240 = local_2d8;
      if (local_488 != (int *)0x0) {
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *local_488;
        *local_488 = *local_488 + -1;
        UNLOCK();
        if (local_248 == 1) {
          if (local_470 == (long *)0x0) {
            if (local_490 != (Allocator *)0x0) {
              free(local_490);
            }
          }
          else {
            (**(code **)(*local_470 + 0x18))(local_470,local_490);
          }
        }
      }
      local_490 = (Allocator *)0x0;
      local_480 = 0;
      local_478 = 0;
      local_468 = 0;
      local_464 = 0;
      local_460 = 0;
      local_45c = 0;
      local_458 = 0;
      local_450 = 0;
      local_488 = (int *)0x0;
      local_2c8 = &local_448;
      local_260 = local_2c8;
      if (local_440 != (int *)0x0) {
        local_264 = 0xffffffff;
        LOCK();
        local_268 = *local_440;
        *local_440 = *local_440 + -1;
        UNLOCK();
        if (local_268 == 1) {
          if (local_428 == (long *)0x0) {
            if (local_448 != (void *)0x0) {
              free(local_448);
            }
          }
          else {
            (**(code **)(*local_428 + 0x18))(local_428,local_448);
          }
        }
      }
      local_448 = (void *)0x0;
      local_438 = 0;
      local_430 = 0;
      local_420 = 0;
      local_41c = 0;
      local_418 = 0;
      local_414 = 0;
      local_410 = 0;
      local_408 = 0;
      local_440 = (int *)0x0;
    }
    else {
      local_344 = -100;
      local_3f8 = 1;
    }
  }
  else {
    local_344 = -100;
    local_3f8 = 1;
  }
  ppvVar10 = &local_3e8;
  if (local_3e0 != (int *)0x0) {
    local_284 = 0xffffffff;
    LOCK();
    local_288 = *local_3e0;
    *local_3e0 = *local_3e0 + -1;
    UNLOCK();
    if (local_288 == 1) {
      local_2b8 = ppvVar10;
      local_280 = ppvVar10;
      if (local_3c8 == (long *)0x0) {
        local_10 = local_3e8;
        if (local_3e8 != (void *)0x0) {
          free(local_3e8);
        }
      }
      else {
        (**(code **)(*local_3c8 + 0x18))(local_3c8,local_3e8);
      }
    }
  }
  *ppvVar10 = (void *)0x0;
  ppvVar10[2] = (void *)0x0;
  *(undefined4 *)(ppvVar10 + 3) = 0;
  *(undefined4 *)(ppvVar10 + 5) = 0;
  *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
  *(undefined4 *)(ppvVar10 + 6) = 0;
  *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
  *(undefined4 *)(ppvVar10 + 7) = 0;
  ppvVar10[8] = (void *)0x0;
  ppvVar10[1] = (void *)0x0;
  return local_344;
}

Assistant:

int DeformableConv2D_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}